

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ParseAttrMeta(AsciiParser *this,AttrMeta *out_meta)

{
  uint8_t uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
  *this_00;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  const_iterator cVar8;
  ostream *poVar9;
  mapped_type *pmVar10;
  StreamReader *pSVar11;
  long lVar12;
  _Link_type p_Var13;
  char *pcVar14;
  optional<tinyusdz::Interpolation> oVar15;
  optional<tinyusdz::Token> *this_01;
  optional<std::__cxx11::string> *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  double value;
  string name_err;
  string varname;
  StringData sdata;
  storage_t<double> local_2e0;
  long local_2d8;
  long local_2d0 [2];
  char local_2b9;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [104];
  string local_248;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *local_228;
  long *local_220 [2];
  long local_210 [2];
  undefined1 local_200 [8];
  undefined1 local_1f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 auStack_1d8 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150 [12];
  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
  *local_88;
  optional<tinyusdz::Token> *local_80;
  optional<tinyusdz::Token> *local_78;
  optional<tinyusdz::Token> *local_70;
  optional<std::__cxx11::string> *local_68;
  optional<std::__cxx11::string> *local_60;
  optional<tinyusdz::Token> *local_58;
  optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
  *local_50;
  _Base_ptr local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
  *local_40;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *local_38;
  
  bVar4 = SkipWhitespace(this);
  if (bVar4) {
    pSVar11 = this->_sr;
    uVar2 = pSVar11->idx_;
    if (uVar2 + 1 <= pSVar11->length_) {
      uVar1 = pSVar11->binary_[uVar2];
      pSVar11->idx_ = uVar2 + 1;
      if (uVar1 != '(') {
        if (pSVar11->length_ < uVar2 || 0x7ffffffffffffffe < uVar2) {
          return true;
        }
        pSVar11->idx_ = uVar2;
        return true;
      }
      bVar4 = SkipWhitespaceAndNewline(this,true);
      if (bVar4) {
        local_38 = &out_meta->stringData;
        local_40 = &this->_supported_prop_metas;
        local_48 = &(this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_228 = &out_meta->meta;
        local_88 = (optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                    *)&out_meta->sdrMetadata;
        local_80 = &out_meta->outputName;
        local_78 = &out_meta->renderType;
        local_70 = &out_meta->connectability;
        local_68 = (optional<std::__cxx11::string> *)&out_meta->displayGroup;
        local_60 = (optional<std::__cxx11::string> *)&out_meta->displayName;
        local_58 = &out_meta->bindMaterialAs;
        local_50 = (optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                    *)&out_meta->customData;
        while( true ) {
          pSVar11 = this->_sr;
          uVar2 = pSVar11->idx_;
          if (pSVar11->length_ <= uVar2) {
            return true;
          }
          cVar6 = ((_Alloc_hider *)&pSVar11->binary_)->_M_p[uVar2];
          if (cVar6 == '\0') {
            return true;
          }
          pSVar11->idx_ = uVar2 + 1;
          if (cVar6 == ')') {
            return true;
          }
          if ((long)uVar2 < 0) break;
          pSVar11->idx_ = uVar2;
          local_200 = (undefined1  [8])(local_1f8 + 8);
          local_1f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
          local_1e8._M_local_buf[8] = false;
          local_1e8._M_local_buf[9] = false;
          local_1e8._12_4_ = 0;
          auStack_1d8._0_4_ = 0;
          bVar4 = MaybeTripleQuotedString(this,(StringData *)local_200);
          if ((bVar4) || (bVar4 = MaybeString(this,(StringData *)local_200), bVar4)) {
            ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ::push_back(local_38,(StringData *)local_200);
            bVar4 = SkipWhitespaceAndNewline(this,true);
            cVar6 = bVar4 + '\x01';
            bVar4 = false;
          }
          else {
            cVar6 = '\0';
            bVar4 = true;
          }
          if (local_200 != (undefined1  [8])(local_1f8 + 8)) {
            operator_delete((void *)local_200,(ulong)(local_1f8._8_8_ + 1));
          }
          if (bVar4) {
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            local_248._M_string_length = 0;
            local_248.field_2._M_local_buf[0] = '\0';
            bVar4 = ReadIdentifier(this,&local_248);
            cVar6 = true;
            if (bVar4) {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariableDef>_>_>
                      ::find(&local_40->_M_t,&local_248);
              if (cVar8._M_node == local_48) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"[ASCII]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_200,"ParseAttrMeta",0xd);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((StringData *)local_200,0xce0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                local_2e0 = (storage_t<double>)local_2d0;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2e0,"Unsupported Property metadatum name: {}","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_2b8,(fmt *)&local_2e0,(string *)&local_248,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pSVar11);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_200,(char *)local_2b8,local_2b0._0_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                  operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                }
                if (local_2e0 != (storage_t<double>)local_2d0) {
                  operator_delete((void *)local_2e0,local_2d0[0] + 1);
                }
LAB_0036c0ce:
                cVar6 = true;
                ::std::__cxx11::stringbuf::str();
                PushError(this,(string *)local_2b8);
                if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                  operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
              }
              else {
                local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                local_2b0._0_8_ = (pointer)0x0;
                local_2b0[8] = '\0';
                local_2e0 = (storage_t<double>)local_2d0;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
                Path::Path((Path *)local_200,(string *)&local_2e0,&local_248);
                bVar4 = pathutil::ValidatePropPath((Path *)local_200,(string *)local_2b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_160._M_p != local_150) {
                  operator_delete(local_160._M_p,local_150[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180._M_p != &local_170) {
                  operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b0[1]._0_8_ != &local_190) {
                  operator_delete((void *)local_1b0[1]._0_8_,local_190._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_1d8._24_8_ != local_1b0) {
                  operator_delete((void *)auStack_1d8._24_8_,local_1b0[0]._M_allocated_capacity + 1)
                  ;
                }
                puVar3 = (undefined1 *)
                         CONCAT44(local_1e8._12_4_,CONCAT22(local_1e8._10_2_,local_1e8._8_2_));
                if (puVar3 != auStack_1d8 + 8) {
                  operator_delete(puVar3,auStack_1d8._8_8_ + 1);
                }
                if (local_200 != (undefined1  [8])(local_1f8 + 8)) {
                  operator_delete((void *)local_200,(ulong)(local_1f8._8_8_ + 1));
                }
                if (local_2e0 != (storage_t<double>)local_2d0) {
                  operator_delete((void *)local_2e0,local_2d0[0] + 1);
                }
                if (!bVar4) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                             ,0x56);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"[ASCII]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_200,"ParseAttrMeta",0xd);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"():",3)
                  ;
                  poVar9 = (ostream *)::std::ostream::operator<<((Path *)local_200,0xce8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  local_220[0] = local_210;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_220,"Invalid Property name `{}`: {}","");
                  pSVar11 = (StreamReader *)local_2b8;
                  fmt::format<std::__cxx11::string,std::__cxx11::string>
                            ((string *)&local_2e0,(fmt *)local_220,&local_248,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar11,in_R8);
                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_200,(char *)local_2e0,local_2d8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  if (local_2e0 != (storage_t<double>)local_2d0) {
                    operator_delete((void *)local_2e0,local_2d0[0] + 1);
                  }
                  if (local_220[0] != local_210) {
                    operator_delete(local_220[0],local_210[0] + 1);
                  }
                  ::std::__cxx11::stringbuf::str();
                  PushError(this,(string *)&local_2e0);
                  if (local_2e0 != (storage_t<double>)local_2d0) {
                    operator_delete((void *)local_2e0,local_2d0[0] + 1);
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
                  ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
                }
                if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                  operator_delete((void *)local_2b8,CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                }
                if (bVar4) {
                  cVar6 = true;
                  bVar4 = SkipWhitespaceAndNewline(this,true);
                  if ((bVar4) && (bVar4 = Expect(this,'='), bVar4)) {
                    cVar6 = true;
                    bVar4 = SkipWhitespaceAndNewline(this,true);
                    if (bVar4) {
                      iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                      if (iVar7 == 0) {
                        local_200 = (undefined1  [8])(local_1f8 + 8);
                        local_1f8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                        local_1f8._8_8_ = local_1f8._8_8_ & 0xffffffffffffff00;
                        cVar5 = ReadStringLiteral(this,(string *)local_200);
                        if ((bool)cVar5) {
                          InterpolationFromString
                                    ((optional<tinyusdz::Interpolation> *)local_2b8,
                                     (string *)local_200);
                          if ((out_meta->interpolation).has_value_ == true) {
                            if ((bool)local_2b8[0] == false) {
                              (out_meta->interpolation).has_value_ = false;
                            }
                            else {
                              (out_meta->interpolation).contained =
                                   (storage_t<tinyusdz::Interpolation>)local_2b8._4_4_;
                            }
                          }
                          else if ((bool)local_2b8[0] != false) {
                            (out_meta->interpolation).contained =
                                 (storage_t<tinyusdz::Interpolation>)local_2b8._4_4_;
                            (out_meta->interpolation).has_value_ = true;
                          }
                        }
                        p_Var13 = (_Link_type)local_1f8._8_8_;
                        oVar15 = (optional<tinyusdz::Interpolation>)local_200;
                        if (local_200 != (undefined1  [8])(local_1f8 + 8)) {
LAB_0036c6cf:
                          operator_delete((void *)oVar15,
                                          (ulong)((long)&(p_Var13->super__Rb_tree_node_base).
                                                         _M_color + 1));
                        }
LAB_0036c6d7:
                        if (cVar5 != '\0') goto LAB_0036c6e0;
                      }
                      else {
                        iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                        if (iVar7 == 0) {
                          bVar4 = ReadBasicType(this,(uint32_t *)&local_2e0);
                          if (!bVar4) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                       ,0x56);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"ParseAttrMeta",0xd);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((MetaVariable *)local_200,0xd06);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            lVar12 = 0x1d;
                            pcVar14 = "Failed to parse `elementSize`";
LAB_0036ca2b:
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,pcVar14,lVar12);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"\n",1);
                            goto LAB_0036c0ce;
                          }
                          (out_meta->elementSize).contained =
                               (storage_t<unsigned_int>)local_2e0._0_4_;
                          if ((out_meta->elementSize).has_value_ == false) {
                            (out_meta->elementSize).has_value_ = true;
                          }
                          goto LAB_0036c6e0;
                        }
                        iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                        if (iVar7 == 0) {
                          local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                          local_2b0._0_8_ = (pointer)0x0;
                          local_2b0[8] = '\0';
                          cVar5 = ReadBasicType(this,(token *)local_2b8);
                          if ((bool)cVar5) {
                            local_1f8._8_8_ =
                                 &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                            local_200 = (undefined1  [8])0x0;
                            local_1e8._M_allocated_capacity = (size_type)auStack_1d8;
                            local_1e8._M_local_buf[8] = false;
                            local_1e8._M_local_buf[9] = false;
                            local_1e8._10_2_ = 0;
                            local_1e8._12_4_ = 0;
                            auStack_1d8._0_4_ = auStack_1d8._0_4_ & 0xffffff00;
                            local_2e0 = (storage_t<double>)local_2d0;
                            local_2b9 = cVar5;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_2e0,"colorSpace","");
                            linb::any::operator=((any *)local_200,(token *)local_2b8);
                            ::std::__cxx11::string::_M_assign((string *)local_1e8._M_local_buf);
                            if (local_2e0 != (storage_t<double>)local_2d0) {
                              operator_delete((void *)local_2e0,local_2d0[0] + 1);
                            }
                            local_2e0 = (storage_t<double>)local_2d0;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_2e0,"colorSpace","");
                            pmVar10 = ::std::
                                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                      ::operator[](local_228,(key_type *)&local_2e0);
                            ::std::__cxx11::string::_M_assign((string *)&pmVar10->_name);
                            linb::any::operator=((any *)pmVar10,(any *)local_200);
                            if (local_2e0 != (storage_t<double>)local_2d0) {
                              operator_delete((void *)local_2e0,local_2d0[0] + 1);
                            }
                            MetaVariable::~MetaVariable((MetaVariable *)local_200);
                            cVar5 = local_2b9;
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                       ,0x56);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"ParseAttrMeta",0xd);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((MetaVariable *)local_200,0xd0e);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"Failed to parse `colorSpace`",0x1c);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"\n",1);
                            ::std::__cxx11::stringbuf::str();
                            PushError(this,(string *)&local_2e0);
                            if (local_2e0 != (storage_t<double>)local_2d0) {
                              operator_delete((void *)local_2e0,local_2d0[0] + 1);
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)local_200);
                            ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
                          }
                          if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                            p_Var13 = (_Link_type)CONCAT71(local_2b0._9_7_,local_2b0[8]);
                            oVar15 = (optional<tinyusdz::Interpolation>)local_2b8;
                            goto LAB_0036c6cf;
                          }
                          goto LAB_0036c6d7;
                        }
                        iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                        if (iVar7 == 0) {
                          bVar4 = ReadBasicType(this,(int *)&local_2e0);
                          if (!bVar4) {
                            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200)
                            ;
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                       ,0x56);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"ParseAttrMeta",0xd);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_200,"():",3);
                            poVar9 = (ostream *)
                                     ::std::ostream::operator<<((MetaVariable *)local_200,0xd17);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                            lVar12 = 0x27;
                            pcVar14 = "Failed to parse `unauthoredValuesIndex`";
                            goto LAB_0036ca2b;
                          }
                          local_1f8._8_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                          local_200 = (undefined1  [8])0x0;
                          local_1e8._M_allocated_capacity = (size_type)auStack_1d8;
                          local_1e8._M_local_buf[8] = false;
                          local_1e8._M_local_buf[9] = false;
                          local_1e8._10_2_ = 0;
                          local_1e8._12_4_ = 0;
                          auStack_1d8._0_4_ = auStack_1d8._0_4_ & 0xffffff00;
                          local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2b8,"unauthoredValuesIndex","");
                          linb::any::operator=((any *)local_200,(int *)&local_2e0);
                          ::std::__cxx11::string::_M_assign((string *)local_1e8._M_local_buf);
                          if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                            operator_delete((void *)local_2b8,
                                            CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                          }
                          local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_2b8,"unauthoredValuesIndex","");
                          pmVar10 = ::std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                    ::operator[](local_228,(key_type *)local_2b8);
                          ::std::__cxx11::string::_M_assign((string *)&pmVar10->_name);
                          linb::any::operator=((any *)pmVar10,(any *)local_200);
                          if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                            operator_delete((void *)local_2b8,
                                            CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                          }
                          MetaVariable::~MetaVariable((MetaVariable *)local_200);
                        }
                        else {
                          iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                          if (iVar7 == 0) {
                            local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
                            local_1f8._8_8_ = (_Link_type)0x0;
                            local_1e8._M_allocated_capacity = (size_type)local_1f8;
                            local_1e8._8_2_ = (undefined2)local_1e8._M_allocated_capacity;
                            local_1e8._10_2_ = (undefined2)(local_1e8._M_allocated_capacity >> 0x10)
                            ;
                            local_1e8._12_4_ = (undefined4)(local_1e8._M_allocated_capacity >> 0x20)
                            ;
                            auStack_1d8._0_4_ = 0;
                            auStack_1d8._4_4_ = 0;
                            bVar4 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)local_200);
                            this_00 = local_50;
joined_r0x0036c687:
                            if (!bVar4) {
                              ::std::
                              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                              ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                          *)local_200,(_Link_type)local_1f8._8_8_);
                              goto LAB_0036c126;
                            }
                            nonstd::optional_lite::
                            optional<std::map<std::__cxx11::string,tinyusdz::MetaVariable,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::MetaVariable>>>>
                            ::operator=(this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                 *)local_200);
                            ::std::
                            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                        *)local_200,(_Link_type)local_1f8._8_8_);
                          }
                          else {
                            iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                            if (iVar7 == 0) {
                              bVar4 = ReadBasicType(this,(double *)&local_2e0);
                              if (!bVar4) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_200);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"ParseAttrMeta",0xd);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<((MetaVariable *)local_200,0xd2b)
                                ;
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                lVar12 = 0x18;
                                pcVar14 = "Failed to parse `weight`";
                                goto LAB_0036ca2b;
                              }
                              (out_meta->weight).contained = local_2e0;
                              if ((out_meta->weight).has_value_ == false) {
                                (out_meta->weight).has_value_ = true;
                              }
                            }
                            else {
                              iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                              if (iVar7 == 0) {
                                local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                local_2b0._0_8_ = (pointer)0x0;
                                local_2b0[8] = '\0';
                                bVar4 = ReadBasicType(this,(token *)local_2b8);
                                if (bVar4) {
                                  iVar7 = ::std::__cxx11::string::compare(local_2b8);
                                  this_01 = local_58;
                                  if ((iVar7 != 0) &&
                                     (iVar7 = ::std::__cxx11::string::compare(local_2b8),
                                     this_01 = local_58, iVar7 != 0)) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"[warn]",6);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"ParseAttrMeta",0xd);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)local_200,0xd3a);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "Unsupported token for bindMaterialAs: ",0x26);
                                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                       ((ostream *)local_200,(char *)local_2b8,
                                                        local_2b0._0_8_);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9,"\n",1);
                                    ::std::__cxx11::stringbuf::str();
                                    PushWarn(this,(string *)&local_2e0);
                                    if (local_2e0 != (storage_t<double>)local_2d0) {
                                      operator_delete((void *)local_2e0,local_2d0[0] + 1);
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
                                    this_01 = local_58;
                                  }
                                  goto LAB_0036c980;
                                }
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_200);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"ParseAttrMeta",0xd);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<((MetaVariable *)local_200,0xd33)
                                ;
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                lVar12 = 0x20;
                                pcVar14 = "Failed to parse `bindMaterialAs`";
LAB_0036d19b:
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,pcVar14,lVar12);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_200,"\n",1);
                                ::std::__cxx11::stringbuf::str();
                                PushError(this,(string *)&local_2e0);
                                if (local_2e0 != (storage_t<double>)local_2d0) {
                                  operator_delete((void *)local_2e0,local_2d0[0] + 1);
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_200);
                                ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
LAB_0036d211:
                                if (local_2b8 != (undefined1  [8])((long)local_2b0 + 8)) {
                                  operator_delete((void *)local_2b8,
                                                  CONCAT71(local_2b0._9_7_,local_2b0[8]) + 1);
                                }
                              }
                              else {
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                  local_2b0._0_8_ = (pointer)0x0;
                                  local_2b0[8] = '\0';
                                  bVar4 = ReadStringLiteral(this,(string *)local_2b8);
                                  this_02 = local_60;
                                  if (!bVar4) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"ParseAttrMeta",0xd);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)local_200,0xd41);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    lVar12 = 0x2a;
                                    pcVar14 = "Failed to parse `displayName`(string type)";
                                    goto LAB_0036d19b;
                                  }
LAB_0036cb5f:
                                  nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                                            (this_02,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_2b8);
                                  goto LAB_0036d211;
                                }
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                  local_2b0._0_8_ = (pointer)0x0;
                                  local_2b0[8] = '\0';
                                  bVar4 = ReadStringLiteral(this,(string *)local_2b8);
                                  this_02 = local_68;
                                  if (bVar4) goto LAB_0036cb5f;
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_200);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"ParseAttrMeta",0xd);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"():",3);
                                  poVar9 = (ostream *)
                                           ::std::ostream::operator<<
                                                     ((ostringstream *)local_200,0xd48);
                                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1)
                                  ;
                                  lVar12 = 0x2b;
                                  pcVar14 = "Failed to parse `displayGroup`(string type)";
                                  goto LAB_0036d19b;
                                }
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                  local_2b0._0_8_ = (pointer)0x0;
                                  local_2b0[8] = '\0';
                                  bVar4 = ReadBasicType(this,(token *)local_2b8);
                                  this_01 = local_70;
                                  if (!bVar4) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"ParseAttrMeta",0xd);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)local_200,0xd50);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    lVar12 = 0x20;
                                    pcVar14 = "Failed to parse `connectability`";
                                    goto LAB_0036d19b;
                                  }
LAB_0036c980:
                                  nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                                            (this_01,(Token *)local_2b8);
                                  goto LAB_0036d211;
                                }
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                  local_2b0._0_8_ = (pointer)0x0;
                                  local_2b0[8] = '\0';
                                  bVar4 = ReadBasicType(this,(token *)local_2b8);
                                  this_01 = local_78;
                                  if (!bVar4) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"ParseAttrMeta",0xd);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)local_200,0xd57);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    lVar12 = 0x1c;
                                    pcVar14 = "Failed to parse `renderType`";
                                    goto LAB_0036d19b;
                                  }
                                  goto LAB_0036c980;
                                }
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_2b8 = (undefined1  [8])((long)local_2b0 + 8);
                                  local_2b0._0_8_ = (pointer)0x0;
                                  local_2b0[8] = '\0';
                                  bVar4 = ReadBasicType(this,(token *)local_2b8);
                                  this_01 = local_80;
                                  if (!bVar4) {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)local_200);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"ParseAttrMeta",0xd);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)local_200,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)local_200,0xd5e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    lVar12 = 0x1c;
                                    pcVar14 = "Failed to parse `outputName`";
                                    goto LAB_0036d19b;
                                  }
                                  goto LAB_0036c980;
                                }
                                iVar7 = ::std::__cxx11::string::compare((char *)&local_248);
                                if (iVar7 == 0) {
                                  local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
                                  local_1f8._8_8_ = (_Link_type)0x0;
                                  local_1e8._M_allocated_capacity = (size_type)local_1f8;
                                  local_1e8._8_2_ = (undefined2)local_1e8._M_allocated_capacity;
                                  local_1e8._10_2_ =
                                       (undefined2)(local_1e8._M_allocated_capacity >> 0x10);
                                  local_1e8._12_4_ =
                                       (undefined4)(local_1e8._M_allocated_capacity >> 0x20);
                                  auStack_1d8._0_4_ = 0;
                                  auStack_1d8._4_4_ = 0;
                                  bVar4 = ParseDict(this,(
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                                  *)local_200);
                                  this_00 = local_88;
                                  goto joined_r0x0036c687;
                                }
                                GetPropMetaDefinition
                                          ((optional<tinyusdz::ascii::AsciiParser::VariableDef> *)
                                           local_200,this,&local_248);
                                local_2b8[0] = local_200[0];
                                if ((ostringstream)local_200[0] == (ostringstream)0x1) {
                                  VariableDef::VariableDef
                                            ((VariableDef *)local_2b0,(VariableDef *)local_1f8);
                                }
                                if ((local_200[0] & 1) != 0) {
                                  nonstd::optional_lite::detail::
                                  storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
                                  destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)local_1f8);
                                }
                                if ((bool)local_2b8[0] == true) {
                                  local_1f8._8_8_ =
                                       &linb::any::vtable_for_type<decltype(nullptr)>()::table;
                                  local_200 = (undefined1  [8])0x0;
                                  local_1e8._M_allocated_capacity = (size_type)auStack_1d8;
                                  local_1e8._M_local_buf[8] = false;
                                  local_1e8._M_local_buf[9] = false;
                                  local_1e8._10_2_ = 0;
                                  local_1e8._12_4_ = 0;
                                  auStack_1d8._0_4_ = auStack_1d8._0_4_ & 0xffffff00;
                                  bVar4 = ParseMetaValue(this,(VariableDef *)local_2b0,
                                                         (MetaVariable *)local_200);
                                  if (bVar4) {
                                    ::std::__cxx11::string::_M_assign
                                              ((string *)local_1e8._M_local_buf);
                                    pmVar10 = ::std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                                              ::operator[](local_228,&local_248);
                                    ::std::__cxx11::string::_M_assign((string *)&pmVar10->_name);
                                    linb::any::operator=((any *)pmVar10,(any *)local_200);
                                  }
                                  MetaVariable::~MetaVariable((MetaVariable *)local_200);
                                }
                                else {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)local_200);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                             ,0x56);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"[ASCII]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"ParseAttrMeta",0xd);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_200,"():",3);
                                  poVar9 = (ostream *)
                                           ::std::ostream::operator<<
                                                     ((ostringstream *)local_200,0xd7e);
                                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1)
                                  ;
                                  local_220[0] = local_210;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_220,
                                             "[InternalErrror] Failed to parse Property metadataum `{}`"
                                             ,"");
                                  fmt::format<std::__cxx11::string>
                                            ((string *)&local_2e0,(fmt *)local_220,
                                             (string *)&local_248,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pSVar11);
                                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                     ((ostream *)local_200,(char *)local_2e0,
                                                      local_2d8);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar9,"\n",1);
                                  if (local_2e0 != (storage_t<double>)local_2d0) {
                                    operator_delete((void *)local_2e0,local_2d0[0] + 1);
                                  }
                                  if (local_220[0] != local_210) {
                                    operator_delete(local_220[0],local_210[0] + 1);
                                  }
                                  ::std::__cxx11::stringbuf::str();
                                  PushError(this,(string *)&local_2e0);
                                  if (local_2e0 != (storage_t<double>)local_2d0) {
                                    operator_delete((void *)local_2e0,local_2d0[0] + 1);
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)local_200);
                                  ::std::ios_base::~ios_base((ios_base *)local_190._M_local_buf);
                                  bVar4 = false;
                                }
                                if ((bool)local_2b8[0] == true) {
                                  nonstd::optional_lite::detail::
                                  storage_t<tinyusdz::ascii::AsciiParser::VariableDef>::
                                  destruct_value((storage_t<tinyusdz::ascii::AsciiParser::VariableDef>
                                                  *)local_2b0);
                                }
                              }
                              if (bVar4 == false) goto LAB_0036c126;
                            }
                          }
                        }
LAB_0036c6e0:
                        bVar4 = SkipWhitespaceAndNewline(this,true);
                        cVar6 = !bVar4;
                      }
                    }
                  }
                }
              }
            }
LAB_0036c126:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,
                              CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                       local_248.field_2._M_local_buf[0]) + 1);
            }
          }
          if (cVar6 == '\x01') {
            return false;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseAttrMeta(AttrMeta *out_meta) {
  // '(' metas ')'
  //
  // currently we only support 'interpolation', 'elementSize' and 'cutomData'

  if (!SkipWhitespace()) {
    return false;
  }

  // The first character.
  {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '(') {
      // ok
    } else {
      _sr->seek_from_current(-1);

      // Still ok. No meta
      DCOUT("No attribute meta.");
      return true;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ')') {
      // end meta
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      // May be string only
      {
        value::StringData sdata;
        if (MaybeTripleQuotedString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add triple-quoted string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        } else if (MaybeString(&sdata)) {
          out_meta->stringData.push_back(sdata);

          DCOUT("Add string to attr meta:" << to_string(sdata));
          if (!SkipWhitespaceAndNewline()) {
            return false;
          }
          continue;
        }
      }

      std::string varname;
      if (!ReadIdentifier(&varname)) {
        return false;
      }

      DCOUT("Property/Attribute meta name: " << varname);

      bool supported = _supported_prop_metas.count(varname);
      if (!supported) {
        PUSH_ERROR_AND_RETURN_TAG(
            kAscii,
            fmt::format("Unsupported Property metadatum name: {}", varname));
      }

      {
        std::string name_err;
        if (!pathutil::ValidatePropPath(Path("", varname), &name_err)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format("Invalid Property name `{}`: {}", varname, name_err));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      if (!Expect('=')) {
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }

      //
      // First-class predefind prop metas.
      //
      if (varname == "interpolation") {
        std::string value;
        if (!ReadStringLiteral(&value)) {
          return false;
        }

        DCOUT("Got `interpolation` meta : " << value);
        out_meta->interpolation = InterpolationFromString(value);
      } else if (varname == "elementSize") {
        uint32_t value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `elementSize`");
        }

        DCOUT("Got `elementSize` meta : " << value);
        out_meta->elementSize = value;
      } else if (varname == "colorSpace") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `colorSpace`");
        }
        // Add as custom meta value.
        MetaVariable metavar;
        metavar.set_value("colorSpace", tok);
        out_meta->meta["colorSpace"] = metavar;
      } else if (varname == "unauthoredValuesIndex") {
        int value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `unauthoredValuesIndex`");
        }

        DCOUT("Got `unauthoredValuesIndex` meta : " << value);
        MetaVariable metavar;
        metavar.set_value("unauthoredValuesIndex", value);
        out_meta->meta["unauthoredValuesIndex"] = metavar;
      } else if (varname == "customData") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        DCOUT("Got `customData` meta");
        out_meta->customData = dict;

      } else if (varname == "weight") {
        double value;
        if (!ReadBasicType(&value)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `weight`");
        }

        DCOUT("Got `weight` meta : " << value);
        out_meta->weight = value;
      } else if (varname == "bindMaterialAs") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `bindMaterialAs`");
        }
        if ((tok.str() == kWeaderThanDescendants) ||
            (tok.str() == kStrongerThanDescendants)) {
          // ok
        } else {
          // still valid though
          PUSH_WARN("Unsupported token for bindMaterialAs: " << tok.str());
        }
        DCOUT("bindMaterialAs: " << tok);
        out_meta->bindMaterialAs = tok;
      } else if (varname == "displayName") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayName`(string type)");
        }
        DCOUT("displayName: " << str);
        out_meta->displayName = str;
      } else if (varname == "displayGroup") {
        std::string str;
        if (!ReadStringLiteral(&str)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `displayGroup`(string type)");
        }
        DCOUT("displayGroup: " << str);
        out_meta->displayGroup = str;

      } else if (varname == "connectability") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `connectability`");
        }
        DCOUT("connectability: " << tok);
        out_meta->connectability = tok;
      } else if (varname == "renderType") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `renderType`");
        }
        DCOUT("renderType: " << tok);
        out_meta->renderType = tok;
      } else if (varname == "outputName") {
        value::token tok;
        if (!ReadBasicType(&tok)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `outputName`");
        }
        DCOUT("outputName: " << tok);
        out_meta->outputName = tok;
      } else if (varname == "sdrMetadata") {
        Dictionary dict;

        if (!ParseDict(&dict)) {
          return false;
        }

        out_meta->sdrMetadata = dict;
      } else {
        if (auto pv = GetPropMetaDefinition(varname)) {
          // Parse as generic metadata variable
          MetaVariable metavar;
          const auto &vardef = pv.value();

          if (!ParseMetaValue(vardef, &metavar)) {
            return false;
          }
          metavar.set_name(varname);

          // add to custom meta
          out_meta->meta[varname] = metavar;

        } else {
          // This should not happen though.
          PUSH_ERROR_AND_RETURN_TAG(
              kAscii,
              fmt::format(
                  "[InternalErrror] Failed to parse Property metadataum `{}`",
                  varname));
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  return true;
}